

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dlba_encoder.hpp
# Opt level: O1

void __thiscall
duckdb::DlbaEncoder::WriteValue<int>(DlbaEncoder *this,WriteStream *param_1,int *param_2)

{
  InternalException *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"DlbaEncoder should only be used with strings","");
  duckdb::InternalException::InternalException(this_00,(string *)local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void WriteValue(WriteStream &, const T &) {
		throw InternalException("DlbaEncoder should only be used with strings");
	}